

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::interpret(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  Xt *pXVar1;
  bool bVar2;
  int iVar3;
  Xt index;
  Cell CVar4;
  InterpretStates IVar5;
  Definition *pDVar6;
  string currentWord;
  undefined1 local_80 [80];
  
  currentWord._M_dataplus._M_p = (pointer)&currentWord.field_2;
  index = 0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&currentWord,0x21,'\0');
  this_00 = &this->dStack;
LAB_00128246:
  IVar5 = this->InterpretState;
  if (IVar5 != InterpretSource) goto LAB_0012835b;
  skipSpacesInSource(this);
  iVar3 = getSourceBufferRemain(this);
  if (iVar3 < 1) {
    bVar2 = refillNextLine(this);
    if (!bVar2) {
      if ((this->savedInput).
          super__Vector_base<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          (this->savedInput).
          super__Vector_base<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        std::__cxx11::string::~string((string *)&currentWord);
        return;
      }
      RestoreInput(this);
      if ((this->InterpretState != InterpretWords) || (this->next_command == 0)) goto LAB_00128355;
      index = dataSpaceAtCell(this,this->next_command);
      goto LAB_0012833e;
    }
    goto LAB_00128355;
  }
  index = blWordFind(this,&currentWord);
  if (index == 0) goto LAB_001282f7;
  CVar4 = getIsCompiling(this);
  if ((CVar4 != 0) &&
     (pDVar6 = getDefinition(this,index), (pDVar6->flags & pDVar6->FlagImmediate) == 0)) {
    data(this,index);
    goto LAB_00128355;
  }
  this->InterpretState = InterpretWords;
  goto LAB_00128364;
LAB_001282f7:
  index = 0;
  if (currentWord._M_string_length != 0) {
    bVar2 = interpretNumbers(this,&currentWord);
    index = 0;
    if (!bVar2) {
      ForthStack<unsigned_int>::push(this_00,0xfffffff3);
      exceptionsThrow(this);
      index = dataSpaceAtCell(this,this->next_command);
LAB_0012833e:
      this->next_command = this->next_command + 4;
    }
LAB_00128355:
    IVar5 = this->InterpretState;
LAB_0012835b:
    if (IVar5 == InterpretWords) {
LAB_00128364:
      pDVar6 = getDefinition(this,index);
      while (((code *)pDVar6->code == execute && (*(long *)&pDVar6->field_0x8 == 0))) {
        requireDStackDepth(this,1,"EXECUTE");
        index = ForthStack<unsigned_int>::getTop(this_00);
        ForthStack<unsigned_int>::pop(this_00);
        pDVar6 = getDefinition(this,index);
      }
      pDVar6 = getDefinition(this,index);
      Definition::Definition((Definition *)local_80,pDVar6);
      executeDefinition(this,(Definition *)local_80);
      std::__cxx11::string::~string((string *)(local_80 + 0x20));
      if (this->next_command == 0) {
        this->InterpretState = InterpretSource;
      }
      else {
        index = dataSpaceAtCell(this,this->next_command);
        pXVar1 = &this->next_command;
        *pXVar1 = *pXVar1 + 4;
        if (*pXVar1 != 0) goto LAB_00128246;
      }
      this->InterpretState = InterpretSource;
    }
  }
  goto LAB_00128246;
}

Assistant:

void interpret() {
			Xt xt{};
			std::string currentWord(33,0); // reserve at least 33 chars in word
			while (true){
				if (InterpretState == InterpretSource){
					skipSpacesInSource();
					if (getSourceBufferRemain() >0 ) {
						xt=blWordFind(currentWord);
						if (xt>0) {
							if (getIsCompiling() && !getDefinition(xt)->isImmediate()) {
								data(CELL(xt));
							}
							else {
								InterpretState = InterpretWords;
							}
						}
						else {
							if (currentWord.size() > 0) {
								if (!interpretNumbers(currentWord)){
									// uncomment during debug if information is needed about wrong words
									//std::cerr << "!!!Wrong word "<<currentWord<<std::endl;
									push(CELL(-13));
									exceptionsThrow();
									xt = getDataCell(next_command);
									next_command += sizeof(next_command);
								}
							}
							else {
								// read buffer empty
								// on next cycle go to 'refill' branch
								continue;
							}
						}
					}
					else {
						// 'refill' branch
						auto refillFlag = refillNextLine();
						// input sorce empty (no lines in input buffer, no lines in file, 
						// evaluate source ended, block ended) ?
						if (!refillFlag){  
							auto qty = savedInput.size();  	// if empty, check saved input sources
							if (qty > 0){					// if have saved source - restore it and run
								RestoreInput();
								if (InterpretState == InterpretWords){
									if (next_command != 0){
										xt = getDataCell(next_command);
										next_command += sizeof(next_command);
									}
								}
							}
							else {
								break; // all input buffers are empty. break and return from interpret()
							}
						}
					}
				}
				if (InterpretState == InterpretWords){
					auto defn = getDefinition(xt);
					while (defn->code == &Forth::execute) {
						REQUIRE_DSTACK_DEPTH(1, "EXECUTE");
						xt = dStack.getTop(); dStack.pop();
						defn = getDefinition(xt);
					}
#ifdef FORTHSCRIPTCPP_ENABLE_INTERNALDEBUGGER
					if (stepfunction){
						if (currentstep-- == 0){
							stepfunction(this, xt, next_command);
							currentstep = maxstep;
						}
					}
#endif
					executeDefinition(*getDefinition(xt));
					if (next_command == 0){
						InterpretState = InterpretSource;
					}
					else {
						xt = getDataCell(next_command);
						next_command += sizeof(next_command);
					}
					if (next_command == 0){
						InterpretState = InterpretSource;
					}
				}
			}
		}